

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int glfwExtensionSupported(char *extension)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  _GLFWwindow *p_Var3;
  GLubyte *pGVar4;
  uint uVar5;
  char *format;
  ulong uVar6;
  bool bVar7;
  GLint count;
  undefined8 uStack_38;
  
  if (_glfwInitialized == '\0') {
    iVar2 = 0x10001;
  }
  else {
    uStack_38 = in_RAX;
    p_Var3 = _glfwPlatformGetCurrentContext();
    if (p_Var3 == (_GLFWwindow *)0x0) {
      iVar2 = 0x10002;
    }
    else {
      if ((extension != (char *)0x0) && (*extension != '\0')) {
        if (2 < p_Var3->glMajor) {
          uVar6 = (long)&uStack_38 + 4;
          glGetIntegerv(0x821d,uVar6);
          bVar1 = 0 < uStack_38._4_4_;
          if (0 < uStack_38._4_4_) {
            uVar5 = 0;
            do {
              pGVar4 = (*p_Var3->GetStringi)(0x1f03,uVar5);
              if (pGVar4 == (GLubyte *)0x0) {
                bVar7 = false;
                _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)uVar5);
                uVar6 = 0;
              }
              else {
                iVar2 = strcmp((char *)pGVar4,extension);
                bVar7 = iVar2 != 0;
                uVar6 = uVar6 & 0xffffffff;
                if (!bVar7) {
                  uVar6 = 1;
                }
              }
              if (!bVar7) break;
              uVar5 = uVar5 + 1;
              bVar1 = (int)uVar5 < uStack_38._4_4_;
            } while ((int)uVar5 < uStack_38._4_4_);
          }
          if (bVar1) {
            return (int)uVar6;
          }
LAB_0010785d:
          iVar2 = _glfwPlatformExtensionSupported(extension);
          return iVar2;
        }
        pGVar4 = (GLubyte *)glGetString(0x1f03);
        if (pGVar4 != (GLubyte *)0x0) {
          iVar2 = _glfwStringInExtensionString(extension,pGVar4);
          if (iVar2 != 0) {
            return 1;
          }
          goto LAB_0010785d;
        }
        format = "Failed to retrieve extension string";
        iVar2 = 0x10008;
        goto LAB_001077ab;
      }
      iVar2 = 0x10004;
    }
  }
  format = (char *)0x0;
LAB_001077ab:
  _glfwInputError(iVar2,format);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    const GLubyte* extensions;
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (!extension || *extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

    if (window->glMajor < 3)
    {
        // Check if extension is in the old style OpenGL extensions string

        extensions = glGetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }
#if defined(_GLFW_USE_OPENGL)
    else
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
#endif // _GLFW_USE_OPENGL

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}